

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O2

void __thiscall
ot::commissioner::UdpSocket::SetEventHandler(UdpSocket *this,EventHandler *aEventHandler)

{
  undefined8 uVar1;
  _Any_data local_78;
  _Manager_type local_68;
  _Invoker_type p_Stack_60;
  UdpSocket *local_50;
  _Any_data local_48;
  long local_38;
  undefined8 uStack_30;
  _Any_data __tmp;
  
  local_50 = this;
  std::function<void_(short)>::function((function<void_(short)> *)&local_48,aEventHandler);
  local_68 = (_Manager_type)0x0;
  p_Stack_60 = (_Invoker_type)0x0;
  local_78._M_unused._M_object = (void *)0x0;
  local_78._8_8_ = 0;
  __tmp._M_unused._M_object = operator_new(0x28);
  *(UdpSocket **)__tmp._M_unused._0_8_ = local_50;
  *(undefined8 *)((long)__tmp._M_unused._0_8_ + 8) = 0;
  *(undefined8 *)((long)__tmp._M_unused._0_8_ + 0x10) = 0;
  *(undefined8 *)((long)__tmp._M_unused._0_8_ + 0x18) = 0;
  *(undefined8 *)((long)__tmp._M_unused._0_8_ + 0x20) = uStack_30;
  if (local_38 != 0) {
    *(void **)((long)__tmp._M_unused._0_8_ + 8) = local_48._M_unused._M_object;
    *(undefined8 *)((long)__tmp._M_unused._0_8_ + 0x10) = local_48._8_8_;
    *(long *)((long)__tmp._M_unused._0_8_ + 0x18) = local_38;
    local_38 = 0;
    uStack_30 = 0;
  }
  __tmp._8_8_ = local_78._8_8_;
  local_78._M_unused._0_8_ =
       (undefined8)
       *(undefined8 *)&(this->super_Socket).mEventHandler.super__Function_base._M_functor;
  uVar1 = *(undefined8 *)
           ((long)&(this->super_Socket).mEventHandler.super__Function_base._M_functor + 8);
  *(undefined8 *)&(this->super_Socket).mEventHandler.super__Function_base._M_functor =
       __tmp._M_unused._M_object;
  *(undefined8 *)((long)&(this->super_Socket).mEventHandler.super__Function_base._M_functor + 8) =
       local_78._8_8_;
  local_68 = (this->super_Socket).mEventHandler.super__Function_base._M_manager;
  p_Stack_60 = (this->super_Socket).mEventHandler._M_invoker;
  (this->super_Socket).mEventHandler.super__Function_base._M_manager =
       std::
       _Function_handler<void_(short),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/socket.cpp:258:21)>
       ::_M_manager;
  (this->super_Socket).mEventHandler._M_invoker =
       std::
       _Function_handler<void_(short),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/src/library/socket.cpp:258:21)>
       ::_M_invoke;
  local_78._8_8_ = uVar1;
  std::_Function_base::~_Function_base((_Function_base *)&local_78);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  return;
}

Assistant:

void UdpSocket::SetEventHandler(EventHandler aEventHandler)
{
    mEventHandler = [this, aEventHandler](short aFlags) {
        if (mIsBound && !mIsConnected && (aFlags & EV_READ))
        {
            mbedtls_net_context connectedCtx;
            mbedtls_net_init(&connectedCtx);

            // This will get 'mNetCtx' connected and returned as 'connectCtx'.
            int rval = mbedtls_net_accept(&mNetCtx, &connectedCtx, nullptr, 0, nullptr);
            if (rval != 0)
            {
                LOG_INFO(LOG_REGION_SOCKET, "UDP socket(={}) accept new connection failed: {}",
                         static_cast<void *>(this), rval);
            }
            else
            {
                mbedtls_net_free(&mNetCtx);

                // We know that 'connectedCtx' has the same fd as the original 'mNetCtx' before accept.
                mNetCtx      = connectedCtx;
                mIsConnected = true;
            }
        }

        // Do not handle event unless the socket is connected.
        if (mIsConnected)
        {
            aEventHandler(aFlags);
        }
    };
}